

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::setEigenDecomposition
          (EigenDecompositionSquare<double,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  size_t __n;
  
  memcpy((this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex],inEigenValues,
         (ulong)(uint)this->kEigenValuesSize << 3);
  iVar2 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  __n = (ulong)(uint)(iVar2 * iVar2) << 3;
  memcpy(this->gEMatrices[eigenIndex],inEigenVectors,__n);
  memcpy(this->gIMatrices[eigenIndex],inInverseEigenVectors,__n);
  if (((this->super_EigenDecomposition<double,_1>).kFlags & 0x200000) != 0) {
    iVar2 = (this->super_EigenDecomposition<double,_1>).kStateCount;
    lVar3 = (long)iVar2;
    if (1 < lVar3) {
      pdVar6 = this->gIMatrices[eigenIndex] + lVar3;
      pdVar5 = this->gIMatrices[eigenIndex] + 1;
      uVar7 = 0;
      lVar4 = lVar3;
      do {
        lVar4 = lVar4 + -1;
        lVar9 = 0;
        pdVar8 = pdVar6;
        do {
          dVar1 = pdVar5[lVar9];
          pdVar5[lVar9] = *pdVar8;
          *pdVar8 = dVar1;
          lVar9 = lVar9 + 1;
          pdVar8 = pdVar8 + lVar3;
        } while (lVar4 != lVar9);
        uVar7 = uVar7 + 1;
        pdVar5 = pdVar5 + lVar3 + 1;
        pdVar6 = pdVar6 + lVar3 + 1;
      } while (uVar7 != iVar2 - 1);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}